

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O1

Pubkey * __thiscall cfd::core::Pubkey::Compress(Pubkey *__return_storage_ptr__,Pubkey *this)

{
  bool bVar1;
  pointer __dest;
  ulong uVar2;
  size_t __n;
  ByteData compress_data;
  ByteData local_48;
  ByteData local_30;
  
  bVar1 = IsCompress(this);
  if (bVar1) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  }
  else {
    WallyUtil::CompressPubkey(&local_30,&this->data_);
    local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar2 = (long)local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (uVar2 == 0) {
      __dest = (pointer)0x0;
    }
    else {
      if ((long)uVar2 < 0) {
        ::std::__throw_bad_alloc();
      }
      __dest = (pointer)operator_new(uVar2);
    }
    local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = __dest + uVar2;
    __n = (long)local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
    local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = __dest;
    if (__n != 0) {
      local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = __dest;
      memmove(__dest,local_30.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,__n);
    }
    local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = __dest + __n;
    Pubkey(__return_storage_ptr__,&local_48);
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Pubkey Pubkey::Compress() const {
  if (IsCompress()) {
    return *this;
  }

  ByteData compress_data = WallyUtil::CompressPubkey(data_);
  return Pubkey(compress_data);
}